

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

size_t tinfl_decompress_mem_to_mem
                 (void *pOut_buf,size_t out_buf_len,void *pSrc_buf,size_t src_buf_len,int flags)

{
  tinfl_status tVar1;
  void *local_2b38;
  undefined1 local_2b28 [4];
  tinfl_status status;
  tinfl_decompressor decomp;
  size_t sStack_28;
  int flags_local;
  size_t src_buf_len_local;
  void *pSrc_buf_local;
  size_t out_buf_len_local;
  void *pOut_buf_local;
  
  local_2b28 = (undefined1  [4])0x0;
  decomp._10996_4_ = flags;
  sStack_28 = src_buf_len;
  src_buf_len_local = (size_t)pSrc_buf;
  pSrc_buf_local = (void *)out_buf_len;
  out_buf_len_local = (size_t)pOut_buf;
  tVar1 = tinfl_decompress((tinfl_decompressor *)local_2b28,(mz_uint8 *)pSrc_buf,
                           &stack0xffffffffffffffd8,(mz_uint8 *)pOut_buf,(mz_uint8 *)pOut_buf,
                           (size_t *)&pSrc_buf_local,flags & 0xfffffffdU | 4);
  if (tVar1 == TINFL_STATUS_DONE) {
    local_2b38 = pSrc_buf_local;
  }
  else {
    local_2b38 = (void *)0xffffffffffffffff;
  }
  return (size_t)local_2b38;
}

Assistant:

size_t tinfl_decompress_mem_to_mem(void *pOut_buf, size_t out_buf_len,
                                   const void *pSrc_buf, size_t src_buf_len,
                                   int flags) {
  tinfl_decompressor decomp;
  tinfl_status status;
  tinfl_init(&decomp);
  status =
      tinfl_decompress(&decomp, (const mz_uint8 *)pSrc_buf, &src_buf_len,
                       (mz_uint8 *)pOut_buf, (mz_uint8 *)pOut_buf, &out_buf_len,
                       (flags & ~TINFL_FLAG_HAS_MORE_INPUT) |
                           TINFL_FLAG_USING_NON_WRAPPING_OUTPUT_BUF);
  return (status != TINFL_STATUS_DONE) ? TINFL_DECOMPRESS_MEM_TO_MEM_FAILED
                                       : out_buf_len;
}